

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O0

locale booster::locale::impl_std::create_collate
                 (locale *in,string *locale_name,character_facet_type type,utf8_support utf)

{
  collate_byname<char> *__f;
  char *pcVar1;
  ulong uVar2;
  int in_ECX;
  locale *in_RSI;
  _Impl *in_RDI;
  int in_R8D;
  locale base;
  size_t in_stack_ffffffffffffff60;
  locale *in_stack_ffffffffffffff68;
  utf8_collator_from_wide *in_stack_ffffffffffffff70;
  utf8_collator_from_wide *in_stack_ffffffffffffff80;
  locale *in_stack_ffffffffffffff88;
  collate_byname<char> *__other;
  locale *in_stack_ffffffffffffff90;
  locale local_28 [3];
  locale *local_10;
  
  if (in_ECX == 1) {
    if (in_R8D == 3) {
      local_10 = in_RSI;
      std::locale::classic();
      pcVar1 = (char *)operator_new(0x18);
      uVar2 = std::__cxx11::string::c_str();
      std::__cxx11::collate_byname<wchar_t>::collate_byname(pcVar1,uVar2);
      std::locale::locale<std::__cxx11::collate_byname<wchar_t>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (collate_byname<wchar_t> *)in_stack_ffffffffffffff80);
      operator_new(0x20);
      utf8_collator_from_wide::utf8_collator_from_wide
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::locale::locale<booster::locale::impl_std::utf8_collator_from_wide>
                (local_10,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::locale::~locale(local_28);
    }
    else {
      __f = (collate_byname<char> *)operator_new(0x18);
      __other = __f;
      uVar2 = std::__cxx11::string::c_str();
      std::__cxx11::collate_byname<char>::collate_byname((char *)__other,uVar2);
      std::locale::locale<std::__cxx11::collate_byname<char>>
                (in_stack_ffffffffffffff90,(locale *)__other,__f);
    }
  }
  else if (in_ECX == 2) {
    pcVar1 = (char *)operator_new(0x18);
    uVar2 = std::__cxx11::string::c_str();
    std::__cxx11::collate_byname<wchar_t>::collate_byname(pcVar1,uVar2);
    std::locale::locale<std::__cxx11::collate_byname<wchar_t>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (collate_byname<wchar_t> *)in_stack_ffffffffffffff80);
  }
  else {
    std::locale::locale((locale *)in_RDI,in_RSI);
  }
  return (locale)in_RDI;
}

Assistant:

std::locale create_collate( std::locale const &in,
                            std::string const &locale_name,
                            character_facet_type type,
                            utf8_support utf)
{
    switch(type) {
    case char_facet:
        {
            if(utf == utf8_from_wide) {
                std::locale base=
                    std::locale(std::locale::classic(),
                                new std::collate_byname<wchar_t>(locale_name.c_str()));
                return std::locale(in,new utf8_collator_from_wide(base));
            }
            else
            {
                return std::locale(in,new std::collate_byname<char>(locale_name.c_str()));
            }
        }

    case wchar_t_facet:
        return std::locale(in,new std::collate_byname<wchar_t>(locale_name.c_str()));

    #ifdef BOOSTER_HAS_CHAR16_T
    case char16_t_facet:
        return std::locale(in,new std::collate_byname<char16_t>(locale_name.c_str()));
    #endif

    #ifdef BOOSTER_HAS_CHAR32_T
    case char32_t_facet:
        return std::locale(in,new std::collate_byname<char32_t>(locale_name.c_str()));
    #endif
    default:
        return in;
    }
}